

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrecHelper.cpp
# Opt level: O0

DataType getType(string *typeString)

{
  string_view typeName;
  string_view trimCharacters;
  string_view input;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  char *in_RDI;
  __sv_type _Var4;
  string_view tstr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  DataType local_4;
  
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffffb0);
  input._M_str = in_RDI;
  input._M_len = (size_t)in_stack_ffffffffffffffe8;
  trimCharacters._M_str = in_stack_ffffffffffffffe0;
  trimCharacters._M_len = (size_t)_Var4._M_str;
  gmlc::utilities::string_viewOps::trim(input,trimCharacters);
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe0);
  if (bVar1) {
    local_4 = HELICS_CUSTOM;
  }
  else {
    sVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe0)
    ;
    if (sVar2 == 1) {
      pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          &stack0xffffffffffffffe0,0);
      switch(*pvVar3) {
      case 'A':
      case 'a':
        local_4 = HELICS_ANY;
        break;
      default:
        local_4 = HELICS_CUSTOM;
        break;
      case 'C':
      case 'c':
        local_4 = HELICS_COMPLEX;
        break;
      case 'D':
      case 'F':
      case 'd':
      case 'f':
        local_4 = HELICS_DOUBLE;
        break;
      case 'I':
      case 'i':
        local_4 = HELICS_INT;
        break;
      case 'S':
      case 's':
        local_4 = HELICS_STRING;
        break;
      case 'V':
      case 'v':
        local_4 = HELICS_VECTOR;
      }
    }
    else {
      typeName._M_str = (char *)typeString;
      typeName._M_len = (size_t)tstr._M_str;
      local_4 = helics::getTypeFromString(typeName);
    }
  }
  return local_4;
}

Assistant:

DataType getType(const std::string& typeString)
{
    auto tstr = gmlc::utilities::string_viewOps::trim(typeString);
    // trim the string
    if (tstr.empty()) {
        return DataType::HELICS_CUSTOM;
    }
    if (tstr.size() == 1) {
        switch (tstr[0]) {
            case 'a':
            case 'A':
                return DataType::HELICS_ANY;
            case 's':
            case 'S':
                return DataType::HELICS_STRING;
            case 'd':
            case 'D':
            case 'f':
            case 'F':
                return DataType::HELICS_DOUBLE;
            case 'i':
            case 'I':
                return DataType::HELICS_INT;
            case 'c':
            case 'C':
                return DataType::HELICS_COMPLEX;
            case 'v':
            case 'V':
                return DataType::HELICS_VECTOR;
            default:
                return DataType::HELICS_CUSTOM;
        }
    }

    return helics::getTypeFromString(tstr);
}